

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getBasisInverseRowSparse(Highs *this,HighsInt row,HVector *row_ep_buffer)

{
  reference pvVar1;
  reference pvVar2;
  long in_RDX;
  int in_ESI;
  HEkk *in_RDI;
  HVectorBase<double> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  
  HEkk::setNlaPointersForLpAndScale
            (in_RDI,(HighsLp *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  HVectorBase<double>::clear(unaff_retaddr);
  *(undefined4 *)(in_RDX + 4) = 1;
  iVar3 = in_ESI;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDX + 8),0);
  *pvVar1 = iVar3;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)in_ESI);
  *pvVar2 = 1.0;
  *(undefined1 *)(in_RDX + 0x78) = 1;
  HEkk::btran(in_RDI,(HVector *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),2.36240255326609e-317);
  return kOk;
}

Assistant:

HighsStatus Highs::getBasisInverseRowSparse(const HighsInt row,
                                            HVector& row_ep_buffer) {
  ekk_instance_.setNlaPointersForLpAndScale(model_.lp_);
  row_ep_buffer.clear();
  row_ep_buffer.count = 1;
  row_ep_buffer.index[0] = row;
  row_ep_buffer.array[row] = 1;
  row_ep_buffer.packFlag = true;

  ekk_instance_.btran(row_ep_buffer, ekk_instance_.info_.row_ep_density);

  return HighsStatus::kOk;
}